

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmanager.cpp
# Opt level: O2

void __thiscall mwheel::DLManager::unload_library(DLManager *this,path *library_path)

{
  int iVar1;
  iterator __position;
  library_not_loaded *this_00;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  error_unloading_dynamic_library *this_01;
  string sStack_1c8;
  stringstream estream;
  ostream local_198 [376];
  
  __position = std::
               _Rb_tree<boost::filesystem::path,_std::pair<const_boost::filesystem::path,_void_*>,_std::_Select1st<std::pair<const_boost::filesystem::path,_void_*>_>,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
               ::find((_Rb_tree<boost::filesystem::path,_std::pair<const_boost::filesystem::path,_void_*>,_std::_Select1st<std::pair<const_boost::filesystem::path,_void_*>_>,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
                       *)this,library_path);
  if (__position._M_node == (_Base_ptr)&this->field_0x8) {
    std::__cxx11::stringstream::stringstream((stringstream *)&estream);
    poVar3 = std::operator<<(local_198,
                             "ERROR : cannot trying to unload a shared library that was not previously loaded "
                            );
    pbVar4 = boost::filesystem::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,library_path);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar4);
    poVar3 = std::operator<<(local_198,"\tDid you use a wrong name for the library to be unloaded?")
    ;
    std::endl<char,std::char_traits<char>>(poVar3);
    this_00 = (library_not_loaded *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    library_not_loaded::library_not_loaded(this_00,&sStack_1c8);
    __cxa_throw(this_00,&library_not_loaded::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = dlclose(*(undefined8 *)(__position._M_node + 2));
  if (iVar1 == 0) {
    std::
    _Rb_tree<boost::filesystem::path,std::pair<boost::filesystem::path_const,void*>,std::_Select1st<std::pair<boost::filesystem::path_const,void*>>,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
    ::erase_abi_cxx11_((_Rb_tree<boost::filesystem::path,std::pair<boost::filesystem::path_const,void*>,std::_Select1st<std::pair<boost::filesystem::path_const,void*>>,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
                        *)this,__position);
    return;
  }
  pcVar2 = (char *)dlerror();
  std::__cxx11::stringstream::stringstream((stringstream *)&estream);
  poVar3 = std::operator<<(local_198,"ERROR : cannot unload shared library ");
  pbVar4 = boost::filesystem::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,library_path);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar4);
  poVar3 = std::operator<<(local_198,"\t");
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_01 = (error_unloading_dynamic_library *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  error_unloading_dynamic_library::error_unloading_dynamic_library(this_01,&sStack_1c8);
  __cxa_throw(this_01,&error_unloading_dynamic_library::typeinfo,std::runtime_error::~runtime_error)
  ;
}

Assistant:

void DLManager::unload_library(const boost::filesystem::path &library_path) {
#ifdef BOOST_OS_UNIX
  auto it = DLMap::iterator(m_dl_map.find(library_path));
  // The library was not found
  if (it == m_dl_map.end()) {
    stringstream estream;
    estream << "ERROR : cannot trying to unload a shared library that was not previously loaded "
            << library_path << endl;
    estream << "\tDid you use a wrong name for the library to be unloaded?" << endl;
    throw library_not_loaded(estream.str());
  }
  // Close the library
  if (dlclose(it->second)) {
    auto error_message = dlerror();
    stringstream estream;
    estream << "ERROR : cannot unload shared library " << library_path << endl;
    estream << "\t" << error_message << endl;
    throw error_unloading_dynamic_library(estream.str());
  }
  m_dl_map.erase(it);
#endif
}